

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O3

void __thiscall
Func::Func(Func *this,JitArenaAllocator *alloc,JITTimeWorkItem *workItem,
          ThreadContextInfo *threadContextInfo,ScriptContextInfo *scriptContextInfo,
          JITOutputIDL *outputData,EntryPointInfo *epInfo,FunctionJITRuntimeInfo *runtimeInfo,
          JITTimePolymorphicInlineCacheInfo *polymorphicInlineCacheInfo,void *codeGenAllocators,
          ScriptContextProfiler *codeGenProfiler,bool isBackgroundJIT,Func *parentFunc,
          uint postCallByteCodeOffset,RegSlot returnValueRegSlot,bool isInlinedConstructor,
          ProfileId callSiteIdInParentFunc,bool isGetterSetter)

{
  JitArenaAllocator *pJVar1;
  code *pcVar2;
  int32 iVar3;
  bool bVar4;
  bool bVar5;
  CodeGenWorkItemType CVar6;
  ProfileId PVar7;
  uint uVar8;
  uint uVar9;
  RegSlot RVar10;
  RegSlot RVar11;
  BOOL BVar12;
  uint uVar13;
  undefined4 *puVar14;
  JITTimeFunctionBody *pJVar15;
  JITTimeProfileInfo *this_00;
  FunctionJITTimeInfo *pFVar16;
  SymTable *pSVar17;
  JITTimeConstructorCache **__s;
  BVSparse<Memory::JitArenaAllocator> *pBVar18;
  YieldOffsetResumeLabelList *pYVar19;
  ObjTypeSpecFldInfo **ppOVar20;
  ObjTypeSpecFldInfo *this_01;
  uint32 uVar21;
  Func *pFVar22;
  uint i;
  ulong uVar23;
  size_t sVar24;
  
  this->m_alloc = alloc;
  this->m_runtimeInfo = runtimeInfo;
  this->m_threadContextInfo = threadContextInfo;
  this->m_scriptContextInfo = scriptContextInfo;
  this->m_workItem = workItem;
  this->m_polymorphicInlineCacheInfo = polymorphicInlineCacheInfo;
  this->propertiesWrittenTo = (PropertyIdSet *)0x0;
  this->pinnedTypeRefs = (TypeRefSet *)0x0;
  this->singleTypeGuards = (TypePropertyGuardDictionary *)0x0;
  this->equivalentTypeGuards = (EquivalentTypeGuardList *)0x0;
  this->propertyGuardsByPropertyId = (PropertyGuardByPropertyIdMap *)0x0;
  this->ctorCachesByPropertyId = (CtorCachesByPropertyIdMap *)0x0;
  this->callSiteToArgumentsOffsetFixupMap = (CallSiteToArgumentsOffsetFixupMap *)0x0;
  this->indexedPropertyGuardCount = 0;
  JsUtil::
  BaseDictionary<int,_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&(this->lazyBailoutProperties).
                    super_BaseDictionary<int,_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                   ,alloc,0);
  this->anyPropertyMayBeWrittenTo = false;
  this->frameDisplayCheckTable = (FrameDisplayCheckTable *)0x0;
  EhFrame::EhFrame(&(this->m_prologEncoder).ehFrame,(this->m_prologEncoder).buffer,0x80);
  (this->m_prologEncoder).cfiInstrOffset = 0;
  (this->m_prologEncoder).currentInstrOffset = 0;
  (this->m_prologEncoder).cfaWordOffset = 1;
  this->m_forInLoopBaseDepth = 0;
  this->m_forInEnumeratorArrayOffset = -1;
  this->m_localStackHeight = 0;
  this->frameSize = 0;
  this->postCallByteCodeOffset = postCallByteCodeOffset;
  this->returnValueRegSlot = returnValueRegSlot;
  this->firstIRTemp = 0;
  this->actualCount = 0xffff;
  this->firstActualStackOffset = -1;
  this->tryCatchNestingLevel = 0;
  this->m_totalJumpTableSizeInBytesForSwitchStatements = 0;
  this->m_funcStartLabel = (LabelInstr *)0x0;
  this->m_funcEndLabel = (LabelInstr *)0x0;
  this->m_argSlotsForFunctionsCalled = 0;
  this->m_callSiteCount = 0;
  this->m_fg = (FlowGraph *)0x0;
  this->m_labelCount = 0;
  (this->m_regsUsed).word = 0;
  this->loopCount = 0;
  this->unoptimizableArgumentsObjReference = 0;
  this->unoptimizableArgumentsObjReferenceInInlinees = 0;
  this->callSiteIdInParentFunc = callSiteIdInParentFunc;
  this->cachedInlineeFrameInfo = (InlineeFrameInfo *)0x0;
  *(uint *)&this->field_0x240 =
       ((uint)isInlinedConstructor << 0xe | (uint)isGetterSetter << 0xd) +
       (*(uint *)&this->field_0x240 & 0xfc000000) + 0x800;
  this->byteCodeRegisterUses = (ByteCodeRegisterUses *)0x0;
  (this->currentPhases).list.super_ReadOnlyList<Js::Phase,_Memory::ArenaAllocator,_DefaultComparer>.
  alloc = &alloc->super_ArenaAllocator;
  (this->currentPhases).list.super_ReadOnlyList<Js::Phase,_Memory::ArenaAllocator,_DefaultComparer>.
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014d50d0;
  (this->currentPhases).list.super_ReadOnlyList<Js::Phase,_Memory::ArenaAllocator,_DefaultComparer>.
  buffer = (Type)0x0;
  (this->currentPhases).list.super_ReadOnlyList<Js::Phase,_Memory::ArenaAllocator,_DefaultComparer>.
  count = 0;
  (this->currentPhases).list.length = 0;
  (this->currentPhases).list.increment = 4;
  this->allowRemoveBailOutArgInstr = false;
  this->m_inlineeId = 0;
  this->m_bailOutForElidedYieldInsertionPoint = (Instr *)0x0;
  this->argObjSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->m_nonTempLocalVars = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  *(undefined8 *)((long)&this->m_nonTempLocalVars + 2) = 0;
  *(undefined8 *)((long)&this->frameInfo + 2) = 0;
  this->m_entryPointInfo = epInfo;
  JITOutput::JITOutput(&this->m_output,outputData);
  this->m_codeGenProfiler = codeGenProfiler;
  pFVar22 = this;
  if (parentFunc != (Func *)0x0) {
    pFVar22 = parentFunc->topFunc;
  }
  this->topFunc = pFVar22;
  this->parentFunc = parentFunc;
  this->inlineeStart = (Instr *)0x0;
  this->maxInlineeArgOutSize = 0;
  this->m_isBackgroundJIT = isBackgroundJIT;
  this->hasInstrNumber = false;
  this->maintainByteCodeOffset = true;
  this->hasInlinee = false;
  this->thisOrParentInlinerHasArguments = false;
  this->stackNestedFunc = false;
  this->stackClosure = false;
  this->hasAnyStackNestedFunc = false;
  this->hasMarkTempObjects = false;
  this->hasNonSimpleParams = false;
  this->m_cloner = (Cloner *)0x0;
  this->m_cloneMap = (InstrMap *)0x0;
  NativeCodeData::Allocator::Allocator(&this->nativeCodeDataAllocator);
  NativeCodeData::Allocator::Allocator(&this->transferDataAllocator);
  this->m_localVarSlotsOffset = -1;
  this->m_hasLocalVarChangedOffset = -1;
  this->m_codeGenAllocators = codeGenAllocators;
  this->m_yieldOffsetResumeLabelList = (YieldOffsetResumeLabelList *)0x0;
  this->stackArgWithFormalsTracker = (StackArgWithFormalsTracker *)0x0;
  this->m_globalObjTypeSpecFldInfoArray = (ObjTypeSpecFldInfo **)0x0;
  (this->constantAddressRegOpnd).super_SListBase<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount>.
  super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)&this->constantAddressRegOpnd;
  (this->constantAddressRegOpnd).super_SListBase<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount>.
  super_RealCount.count = 0;
  (this->constantAddressRegOpnd).allocator = &alloc->super_ArenaAllocator;
  this->lastConstantAddressRegLoadInstr = (Instr *)0x0;
  this->vtableMap = (VtableHashMap *)0x0;
  this->m_lowerer = (Lowerer *)0x0;
  this->m_localClosureSym = (StackSym *)0x0;
  this->m_paramClosureSym = (StackSym *)0x0;
  this->m_localFrameDisplaySym = (StackSym *)0x0;
  this->m_nativeCodeDataSym = (StackSym *)0x0;
  this->m_inlineeFrameStartSym = (StackSym *)0x0;
  this->m_loopParamSym = (StackSym *)0x0;
  this->m_bailoutReturnValueSym = (StackSym *)0x0;
  this->m_hasBailedOutSym = (StackSym *)0x0;
  this->m_generatorFrameSym = (StackSym *)0x0;
  this->tempSymDouble = (StackSym *)0x0;
  this->tempSymBool = (StackSym *)0x0;
  this->field_0x410 = this->field_0x410 & 0xfe;
  this->m_lazyBailOutRecordSlot = (StackSym *)0x0;
  if ((runtimeInfo == (FunctionJITRuntimeInfo *)0x0) == (this->parentFunc != (Func *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar14 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0xa4,"(this->IsInlined() == !!runtimeInfo)",
                       "this->IsInlined() == !!runtimeInfo");
    if (!bVar4) goto LAB_00426154;
    *puVar14 = 0;
  }
  pJVar15 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
  bVar4 = JITTimeFunctionBody::HasProfileInfo(pJVar15);
  if (bVar4) {
    pJVar15 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
    this_00 = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar15);
    uVar8 = JITTimeProfileInfo::GetLoopCount(this_00);
    pJVar15 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
    uVar9 = JITTimeFunctionBody::GetLoopCount(pJVar15);
    if (uVar8 != uVar9) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0xa6,
                         "(!HasProfileInfo() || GetReadOnlyProfileInfo()->GetLoopCount() == GetJITFunctionBody()->GetLoopCount())"
                         ,
                         "!HasProfileInfo() || GetReadOnlyProfileInfo()->GetLoopCount() == GetJITFunctionBody()->GetLoopCount()"
                        );
      if (!bVar4) goto LAB_00426154;
      *puVar14 = 0;
    }
  }
  pJVar15 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
  RVar10 = JITTimeFunctionBody::GetConstCount(pJVar15);
  pJVar15 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
  RVar11 = JITTimeFunctionBody::GetVarCount(pJVar15);
  if (CARRY4(RVar10,RVar11)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar14 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0xa8,
                       "(!UInt32Math::Add(GetJITFunctionBody()->GetConstCount(), GetJITFunctionBody()->GetVarCount(), &tmpResult))"
                       ,
                       "!UInt32Math::Add(GetJITFunctionBody()->GetConstCount(), GetJITFunctionBody()->GetVarCount(), &tmpResult)"
                      );
    if (!bVar4) goto LAB_00426154;
    *puVar14 = 0;
  }
  pJVar15 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
  bVar4 = JITTimeFunctionBody::IsAsmJsMode(pJVar15);
  if (!bVar4) {
    pJVar15 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
    RVar10 = JITTimeFunctionBody::GetFirstTmpReg(pJVar15);
    pJVar15 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
    RVar11 = JITTimeFunctionBody::GetLocalsCount(pJVar15);
    if (RVar11 < RVar10) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0xa9,
                         "(GetJITFunctionBody()->IsAsmJsMode() || GetJITFunctionBody()->GetFirstTmpReg() <= GetJITFunctionBody()->GetLocalsCount())"
                         ,
                         "GetJITFunctionBody()->IsAsmJsMode() || GetJITFunctionBody()->GetFirstTmpReg() <= GetJITFunctionBody()->GetLocalsCount()"
                        );
      if (!bVar4) goto LAB_00426154;
      *puVar14 = 0;
    }
  }
  bVar4 = JITTimeWorkItem::IsLoopBody(this->m_workItem);
  if (bVar4) {
    uVar8 = JITTimeWorkItem::GetLoopNumber(this->m_workItem);
    pJVar15 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
    uVar9 = JITTimeFunctionBody::GetLoopCount(pJVar15);
    if (uVar9 <= uVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0xaa,
                         "(!IsLoopBody() || m_workItem->GetLoopNumber() < GetJITFunctionBody()->GetLoopCount())"
                         ,
                         "!IsLoopBody() || m_workItem->GetLoopNumber() < GetJITFunctionBody()->GetLoopCount()"
                        );
      if (!bVar4) goto LAB_00426154;
      *puVar14 = 0;
    }
  }
  if ((DAT_015ada8a == '\0') &&
     (bVar4 = Js::ConfigFlagsTable::IsEnabled
                        ((ConfigFlagsTable *)&Js::Configuration::Global,ForceNativeFlag), !bVar4)) {
    pJVar15 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
    uVar8 = JITTimeFunctionBody::GetByteCodeLength(pJVar15);
    if (DAT_015a4e6c <= uVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0xab,
                         "((Js::Configuration::Global.flags.Prejit) || (Js::Configuration::Global.flags.IsEnabled(Js::ForceNativeFlag)) || GetJITFunctionBody()->GetByteCodeLength() < (uint)(Js::Configuration::Global.flags.MaxJITFunctionBytecodeByteLength))"
                         ,
                         "(Js::Configuration::Global.flags.Prejit) || (Js::Configuration::Global.flags.IsEnabled(Js::ForceNativeFlag)) || GetJITFunctionBody()->GetByteCodeLength() < (uint)(Js::Configuration::Global.flags.MaxJITFunctionBytecodeByteLength)"
                        );
      if (!bVar4) goto LAB_00426154;
      *puVar14 = 0;
    }
  }
  pJVar15 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
  JITTimeFunctionBody::EnsureConsistentConstCount(pJVar15);
  if (this->parentFunc == (Func *)0x0) {
    outputData->hasJittedStackClosure = '\0';
    iVar3 = this->m_hasLocalVarChangedOffset;
    outputData->localVarSlotsOffset = this->m_localVarSlotsOffset;
    outputData->localVarChangedOffset = iVar3;
  }
  else {
    uVar21 = this->topFunc->m_inlineeId + 1;
    this->topFunc->m_inlineeId = uVar21;
    this->m_inlineeId = uVar21;
  }
  pJVar15 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
  bVar4 = JITTimeFunctionBody::DoStackNestedFunc(pJVar15);
  pJVar15 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
  bVar5 = JITTimeFunctionBody::DoStackClosure(pJVar15);
  if (bVar5) {
    pJVar15 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
    uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar15);
    pFVar16 = JITTimeWorkItem::GetJITTimeInfo(this->m_workItem);
    uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar16);
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,FrameDisplayFastPathPhase,uVar8,uVar9);
    if (bVar5) goto LAB_004258f7;
    pJVar15 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
    uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar15);
    pFVar16 = JITTimeWorkItem::GetJITTimeInfo(this->m_workItem);
    uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar16);
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,StackClosurePhase,uVar8,uVar9);
    if (bVar4 || bVar5) {
      if (bVar5) goto LAB_004258f7;
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0xbc,"(!doStackClosure || doStackNestedFunc)",
                         "!doStackClosure || doStackNestedFunc");
      if (!bVar5) goto LAB_00426154;
      *puVar14 = 0;
    }
    bVar5 = this->parentFunc == (Func *)0x0;
    this->stackClosure = bVar5;
    if (bVar5) {
      JITOutput::SetHasJITStackClosure(&this->m_output);
    }
  }
  else {
LAB_004258f7:
    this->stackClosure = false;
  }
  CVar6 = JITTimeWorkItem::Type(this->m_workItem);
  if (CVar6 == JsFunctionType) {
    pJVar15 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
    bVar5 = JITTimeFunctionBody::DoBackendArgumentsOptimization(pJVar15);
    if (bVar5) {
      pJVar15 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
      bVar5 = JITTimeFunctionBody::HasTry(pJVar15);
      if ((!bVar5) || (bVar5 = DoOptimizeTry(this), bVar5)) {
        this->field_0x240 = this->field_0x240 | 0x40;
      }
    }
  }
  if (bVar4) {
    pJVar15 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
    uVar8 = JITTimeFunctionBody::GetNestedCount(pJVar15);
    if ((uVar8 != 0) &&
       ((this->parentFunc == (Func *)0x0 ||
        (CVar6 = JITTimeWorkItem::Type(this->topFunc->m_workItem), CVar6 != JsLoopBodyWorkItemType))
       )) {
      bVar4 = JITTimeWorkItem::IsJitInDebugMode(this->m_workItem);
      if (bVar4) {
        pJVar15 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
        bVar4 = JITTimeFunctionBody::IsLibraryCode(pJVar15);
        if (!bVar4) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar14 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                             ,0xcf,
                             "(!(this->IsJitInDebugMode() && !GetJITFunctionBody()->IsLibraryCode()))"
                             ,
                             "!(this->IsJitInDebugMode() && !GetJITFunctionBody()->IsLibraryCode())"
                            );
          if (!bVar4) goto LAB_00426154;
          *puVar14 = 0;
        }
      }
      this->stackNestedFunc = true;
      this->topFunc->hasAnyStackNestedFunc = true;
    }
  }
  pJVar15 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
  bVar4 = JITTimeFunctionBody::HasOrParentHasArguments(pJVar15);
  if (bVar4) {
    this->thisOrParentInlinerHasArguments = true;
    if (parentFunc != (Func *)0x0) goto LAB_00425a59;
LAB_00425acd:
    this->inlineDepth = 0;
    pSVar17 = (SymTable *)new<Memory::JitArenaAllocator>(0x10040,alloc,0x3eba5c);
    memset(pSVar17,0,0x10038);
    this->m_symTable = pSVar17;
    SymTable::Init(pSVar17,this);
    pSVar17 = this->m_symTable;
    pJVar15 = JITTimeWorkItem::GetJITFunctionBody(workItem);
    RVar10 = JITTimeFunctionBody::GetLocalsCount(pJVar15);
    SymTable::SetStartingID(pSVar17,RVar10 + 1);
    if (postCallByteCodeOffset != 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0xe0,"(Js::Constants::NoByteCodeOffset == postCallByteCodeOffset)",
                         "Js::Constants::NoByteCodeOffset == postCallByteCodeOffset");
      if (!bVar4) goto LAB_00426154;
      *puVar14 = 0;
    }
    if (returnValueRegSlot != 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0xe1,"(Js::Constants::NoRegister == returnValueRegSlot)",
                         "Js::Constants::NoRegister == returnValueRegSlot");
      if (!bVar4) goto LAB_00426154;
      *puVar14 = 0;
    }
    bVar4 = HasArgumentSlot(this);
    if (bVar4) {
      this->m_localStackHeight = 8;
    }
  }
  else {
    if (parentFunc == (Func *)0x0) goto LAB_00425acd;
    if (parentFunc->thisOrParentInlinerHasArguments == true) {
      this->thisOrParentInlinerHasArguments = true;
    }
LAB_00425a59:
    this->inlineDepth = parentFunc->inlineDepth + 1;
    if (postCallByteCodeOffset == 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0xef,"(Js::Constants::NoByteCodeOffset != postCallByteCodeOffset)",
                         "Js::Constants::NoByteCodeOffset != postCallByteCodeOffset");
      if (!bVar4) goto LAB_00426154;
      *puVar14 = 0;
    }
  }
  this->constructorCacheCount = 0;
  pJVar1 = this->m_alloc;
  pJVar15 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
  JITTimeFunctionBody::GetProfiledCallSiteCount(pJVar15);
  pJVar15 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
  PVar7 = JITTimeFunctionBody::GetProfiledCallSiteCount(pJVar15);
  if (PVar7 == 0) {
    __s = (JITTimeConstructorCache **)&DAT_00000008;
  }
  else {
    BVar12 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar12 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar4) goto LAB_00426154;
      *puVar14 = 0;
    }
    uVar23 = (ulong)PVar7;
    sVar24 = uVar23 * 8;
    __s = (JITTimeConstructorCache **)
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::AllocInternal
                    ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)pJVar1,
                     sVar24);
    memset(__s,0,sVar24);
    memset(__s + uVar23,0,(ulong)((int)sVar24 + 0xfU & 0xfffffff0) + uVar23 * -8);
    if (__s == (JITTimeConstructorCache **)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar4) goto LAB_00426154;
      *puVar14 = 0;
      __s = (JITTimeConstructorCache **)0x0;
    }
  }
  this->constructorCaches = __s;
  this->m_codeSize = -1;
  this->m_spillSize = -1;
  this->m_argsSize = -1;
  this->m_savedRegSize = -1;
  bVar4 = JITTimeWorkItem::IsJitInDebugMode(this->m_workItem);
  if (bVar4) {
    pBVar18 = (BVSparse<Memory::JitArenaAllocator> *)
              new<Memory::ArenaAllocator>(0x20,&this->m_alloc->super_ArenaAllocator,0x364470);
    pJVar1 = this->m_alloc;
    pBVar18->head = (Type_conflict)0x0;
    pBVar18->lastFoundIndex = (Type_conflict)0x0;
    pBVar18->alloc = pJVar1;
    pBVar18->lastUsedNodePrevNextField = (Type)pBVar18;
    this->m_nonTempLocalVars = pBVar18;
  }
  pJVar15 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
  bVar4 = JITTimeFunctionBody::IsCoroutine(pJVar15);
  if (bVar4) {
    pJVar1 = this->m_alloc;
    pYVar19 = (YieldOffsetResumeLabelList *)new<Memory::JitArenaAllocator>(0x30,pJVar1,0x3eba5c);
    (pYVar19->
    super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
    ).alloc = pJVar1;
    (pYVar19->
    super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
    )._vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014d5150;
    (pYVar19->
    super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
    ).buffer = (Type)0x0;
    (pYVar19->
    super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
    ).count = 0;
    pYVar19->length = 0;
    pYVar19->increment = 4;
    this->m_yieldOffsetResumeLabelList = pYVar19;
  }
  if (this->parentFunc == (Func *)0x0) {
    pJVar1 = this->m_alloc;
    pFVar16 = JITTimeWorkItem::GetJITTimeInfo(this->m_workItem);
    FunctionJITTimeInfo::GetGlobalObjTypeSpecFldInfoCount(pFVar16);
    pFVar16 = JITTimeWorkItem::GetJITTimeInfo(this->m_workItem);
    uVar8 = FunctionJITTimeInfo::GetGlobalObjTypeSpecFldInfoCount(pFVar16);
    if (uVar8 == 0) {
      ppOVar20 = (ObjTypeSpecFldInfo **)&DAT_00000008;
    }
    else {
      BVar12 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar12 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar14 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar4) goto LAB_00426154;
        *puVar14 = 0;
      }
      uVar23 = (ulong)uVar8;
      sVar24 = uVar23 * 8;
      ppOVar20 = (ObjTypeSpecFldInfo **)
                 Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 AllocInternal((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *
                               )pJVar1,sVar24);
      memset(ppOVar20,0,sVar24);
      memset(ppOVar20 + uVar23,0,(sVar24 + 0xf & 0xfffffffffffffff0) + uVar23 * -8);
      if (ppOVar20 == (ObjTypeSpecFldInfo **)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar14 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar4) {
LAB_00426154:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar14 = 0;
        ppOVar20 = (ObjTypeSpecFldInfo **)0x0;
      }
    }
    this->m_globalObjTypeSpecFldInfoArray = ppOVar20;
  }
  uVar8 = 0;
  puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  do {
    pJVar15 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
    uVar9 = JITTimeFunctionBody::GetInlineCacheCount(pJVar15);
    if (uVar9 <= uVar8) {
      pJVar15 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
      uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar15);
      pFVar16 = JITTimeWorkItem::GetJITTimeInfo(this->m_workItem);
      uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar16);
      bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,HoistConstAddrPhase,uVar8,uVar9);
      this->canHoistConstantAddressLoad = !bVar4;
      pJVar15 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
      uVar8 = JITTimeFunctionBody::GetForInLoopDepth(pJVar15);
      this->m_forInLoopMaxDepth = uVar8;
      return;
    }
    pFVar16 = JITTimeWorkItem::GetJITTimeInfo(this->m_workItem);
    this_01 = FunctionJITTimeInfo::GetObjTypeSpecFldInfo(pFVar16,uVar8);
    if (this_01 != (ObjTypeSpecFldInfo *)0x0) {
      uVar9 = ObjTypeSpecFldInfo::GetObjTypeSpecFldId(this_01);
      pFVar16 = JITTimeWorkItem::GetJITTimeInfo(this->topFunc->m_workItem);
      uVar13 = FunctionJITTimeInfo::GetGlobalObjTypeSpecFldInfoCount(pFVar16);
      if (uVar13 <= uVar9) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar14 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                           ,0x113,
                           "(info->GetObjTypeSpecFldId() < GetTopFunc()->GetWorkItem()->GetJITTimeInfo()->GetGlobalObjTypeSpecFldInfoCount())"
                           ,
                           "info->GetObjTypeSpecFldId() < GetTopFunc()->GetWorkItem()->GetJITTimeInfo()->GetGlobalObjTypeSpecFldInfoCount()"
                          );
        if (!bVar4) goto LAB_00426154;
        *puVar14 = 0;
      }
      ppOVar20 = this->topFunc->m_globalObjTypeSpecFldInfoArray;
      uVar9 = ObjTypeSpecFldInfo::GetObjTypeSpecFldId(this_01);
      ppOVar20[uVar9] = this_01;
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

Func::Func(JitArenaAllocator *alloc, JITTimeWorkItem * workItem,
    ThreadContextInfo * threadContextInfo,
    ScriptContextInfo * scriptContextInfo,
    JITOutputIDL * outputData,
    Js::EntryPointInfo* epInfo,
    const FunctionJITRuntimeInfo *const runtimeInfo,
    JITTimePolymorphicInlineCacheInfo * const polymorphicInlineCacheInfo, void * const codeGenAllocators,
#if !FLOATVAR
    CodeGenNumberAllocator * numberAllocator,
#endif
    Js::ScriptContextProfiler *const codeGenProfiler, const bool isBackgroundJIT, Func * parentFunc,
    uint postCallByteCodeOffset, Js::RegSlot returnValueRegSlot, const bool isInlinedConstructor,
    Js::ProfileId callSiteIdInParentFunc, bool isGetterSetter) :
    m_alloc(alloc),
    m_workItem(workItem),
    m_output(outputData),
    m_entryPointInfo(epInfo),
    m_threadContextInfo(threadContextInfo),
    m_scriptContextInfo(scriptContextInfo),
    m_runtimeInfo(runtimeInfo),
    m_polymorphicInlineCacheInfo(polymorphicInlineCacheInfo),
    m_codeGenAllocators(codeGenAllocators),
    m_inlineeId(0),
    pinnedTypeRefs(nullptr),
    singleTypeGuards(nullptr),
    equivalentTypeGuards(nullptr),
    propertyGuardsByPropertyId(nullptr),
    ctorCachesByPropertyId(nullptr),
    callSiteToArgumentsOffsetFixupMap(nullptr),
    indexedPropertyGuardCount(0),
    propertiesWrittenTo(nullptr),
    lazyBailoutProperties(alloc),
    anyPropertyMayBeWrittenTo(false),
#ifdef PROFILE_EXEC
    m_codeGenProfiler(codeGenProfiler),
#endif
    m_isBackgroundJIT(isBackgroundJIT),
    m_cloner(nullptr),
    m_cloneMap(nullptr),
    m_loopParamSym(nullptr),
    m_localClosureSym(nullptr),
    m_paramClosureSym(nullptr),
    m_localFrameDisplaySym(nullptr),
    m_bailoutReturnValueSym(nullptr),
    m_hasBailedOutSym(nullptr),
    m_inlineeFrameStartSym(nullptr),
    inlineeStart(nullptr),
    m_regsUsed(0),
    m_fg(nullptr),
    m_labelCount(0),
    m_argSlotsForFunctionsCalled(0),
    m_hasCalls(false),
    m_hasInlineArgsOpt(false),
    m_hasInlineOverheadRemoved(false),
    m_canDoInlineArgsOpt(true),
    unoptimizableArgumentsObjReference(0),
    unoptimizableArgumentsObjReferenceInInlinees(0),
    m_doFastPaths(false),
    hasBailout(false),
    firstIRTemp(0),
    hasBailoutInEHRegion(false),
    hasInstrNumber(false),
    maintainByteCodeOffset(true),
    frameSize(0),
    topFunc(parentFunc ? parentFunc->topFunc : this),
    parentFunc(parentFunc),
    argObjSyms(nullptr),
    m_nonTempLocalVars(nullptr),
    hasAnyStackNestedFunc(false),
    hasMarkTempObjects(false),
    postCallByteCodeOffset(postCallByteCodeOffset),
    maxInlineeArgOutSize(0),
    returnValueRegSlot(returnValueRegSlot),
    firstActualStackOffset(-1),
    m_localVarSlotsOffset(Js::Constants::InvalidOffset),
    m_hasLocalVarChangedOffset(Js::Constants::InvalidOffset),
    actualCount((Js::ArgSlot) - 1),
    tryCatchNestingLevel(0),
    m_localStackHeight(0),
    tempSymDouble(nullptr),
    tempSymBool(nullptr),
    hasInlinee(false),
    thisOrParentInlinerHasArguments(false),
    hasStackArgs(false),
    hasArgLenAndConstOpt(false),
    hasImplicitParamLoad(false),
    hasThrow(false),
    hasNonSimpleParams(false),
    hasUnoptimizedArgumentsAccess(false),
    applyTargetInliningRemovedArgumentsAccess(false),
    hasImplicitCalls(false),
    hasTempObjectProducingInstr(false),
    isInlinedConstructor(isInlinedConstructor),
#if !FLOATVAR
    numberAllocator(numberAllocator),
#endif
    loopCount(0),
    callSiteIdInParentFunc(callSiteIdInParentFunc),
    isGetterSetter(isGetterSetter),
    cachedInlineeFrameInfo(nullptr),
    frameInfo(nullptr),
    isTJLoopBody(false),
    m_nativeCodeDataSym(nullptr),
    isFlowGraphValid(false),
    legalizePostRegAlloc(false),
#if DBG
    m_callSiteCount(0),
#endif
    stackNestedFunc(false),
    stackClosure(false)
#if defined(_M_ARM32_OR_ARM64)
    , m_ArgumentsOffset(0)
    , m_epilogLabel(nullptr)
#endif
    , m_funcStartLabel(nullptr)
    , m_funcEndLabel(nullptr)
#if DBG
    , hasCalledSetDoFastPaths(false)
    , allowRemoveBailOutArgInstr(false)
    , currentPhases(alloc)
    , isPostLower(false)
    , isPostRegAlloc(false)
    , isPostPeeps(false)
    , isPostLayout(false)
    , isPostFinalLower(false)
    , vtableMap(nullptr)
#endif
    , m_yieldOffsetResumeLabelList(nullptr)
    , m_bailOutForElidedYieldInsertionPoint(nullptr)
    , constantAddressRegOpnd(alloc)
    , lastConstantAddressRegLoadInstr(nullptr)
    , m_totalJumpTableSizeInBytesForSwitchStatements(0)
    , frameDisplayCheckTable(nullptr)
    , stackArgWithFormalsTracker(nullptr)
    , m_forInLoopBaseDepth(0)
    , m_forInEnumeratorArrayOffset(-1)
    , argInsCount(0)
    , m_globalObjTypeSpecFldInfoArray(nullptr)
    , m_generatorFrameSym(nullptr)
#if LOWER_SPLIT_INT64
    , m_int64SymPairMap(nullptr)
#endif
#ifdef RECYCLER_WRITE_BARRIER_JIT
    , m_lowerer(nullptr)
#endif
    , m_lazyBailOutRecordSlot(nullptr)
    , hasLazyBailOut(false)
{

    Assert(this->IsInlined() == !!runtimeInfo);

    AssertOrFailFast(!HasProfileInfo() || GetReadOnlyProfileInfo()->GetLoopCount() == GetJITFunctionBody()->GetLoopCount());
    Js::RegSlot tmpResult;
    AssertOrFailFast(!UInt32Math::Add(GetJITFunctionBody()->GetConstCount(), GetJITFunctionBody()->GetVarCount(), &tmpResult));
    AssertOrFailFast(GetJITFunctionBody()->IsAsmJsMode() || GetJITFunctionBody()->GetFirstTmpReg() <= GetJITFunctionBody()->GetLocalsCount());
    AssertOrFailFast(!IsLoopBody() || m_workItem->GetLoopNumber() < GetJITFunctionBody()->GetLoopCount());
    AssertOrFailFast(CONFIG_FLAG(Prejit) || CONFIG_ISENABLED(Js::ForceNativeFlag) || GetJITFunctionBody()->GetByteCodeLength() < (uint)CONFIG_FLAG(MaxJITFunctionBytecodeByteLength));
    GetJITFunctionBody()->EnsureConsistentConstCount();

    if (this->IsTopFunc())
    {
        outputData->hasJittedStackClosure = false;
        outputData->localVarSlotsOffset = m_localVarSlotsOffset;
        outputData->localVarChangedOffset = m_hasLocalVarChangedOffset;
    }

    if (this->IsInlined())
    {
        m_inlineeId = ++(GetTopFunc()->m_inlineeId);
    }
    bool doStackNestedFunc = GetJITFunctionBody()->DoStackNestedFunc();

    bool doStackClosure = GetJITFunctionBody()->DoStackClosure() && !PHASE_OFF(Js::FrameDisplayFastPathPhase, this) && !PHASE_OFF(Js::StackClosurePhase, this);
    Assert(!doStackClosure || doStackNestedFunc);
    this->stackClosure = doStackClosure && this->IsTopFunc();
    if (this->stackClosure)
    {
        // TODO: calculate on runtime side?
        m_output.SetHasJITStackClosure();
    }

    if (m_workItem->Type() == JsFunctionType &&
        GetJITFunctionBody()->DoBackendArgumentsOptimization() &&
        (!GetJITFunctionBody()->HasTry() || this->DoOptimizeTry()))
    {
        // doBackendArgumentsOptimization bit is set when there is no eval inside a function
        // as determined by the bytecode generator.
        SetHasStackArgs(true);
    }
    if (doStackNestedFunc && GetJITFunctionBody()->GetNestedCount() != 0 &&
        (this->IsTopFunc() || this->GetTopFunc()->m_workItem->Type() != JsLoopBodyWorkItemType)) // make sure none of the functions inlined in a jitted loop body allocate nested functions on the stack
    {
        Assert(!(this->IsJitInDebugMode() && !GetJITFunctionBody()->IsLibraryCode()));
        stackNestedFunc = true;
        this->GetTopFunc()->hasAnyStackNestedFunc = true;
    }

    if (GetJITFunctionBody()->HasOrParentHasArguments() || (parentFunc && parentFunc->thisOrParentInlinerHasArguments))
    {
        thisOrParentInlinerHasArguments = true;
    }

    if (parentFunc == nullptr)
    {
        inlineDepth = 0;
        m_symTable = JitAnew(alloc, SymTable);
        m_symTable->Init(this);
        m_symTable->SetStartingID(static_cast<SymID>(workItem->GetJITFunctionBody()->GetLocalsCount() + 1));

        Assert(Js::Constants::NoByteCodeOffset == postCallByteCodeOffset);
        Assert(Js::Constants::NoRegister == returnValueRegSlot);

#if defined(_M_IX86) ||  defined(_M_X64)
        if (HasArgumentSlot())
        {
            // Pre-allocate the single argument slot we'll reserve for the arguments object.
            // For ARM, the argument slot is not part of the local but part of the register saves
            m_localStackHeight = MachArgsSlotOffset;
        }
#endif
    }
    else
    {
        inlineDepth = parentFunc->inlineDepth + 1;
        Assert(Js::Constants::NoByteCodeOffset != postCallByteCodeOffset);
    }

    this->constructorCacheCount = 0;
    this->constructorCaches = AnewArrayZ(this->m_alloc, JITTimeConstructorCache*, GetJITFunctionBody()->GetProfiledCallSiteCount());

#if DBG_DUMP
    m_codeSize = -1;
#endif

#if defined(_M_X64)
    m_spillSize = -1;
    m_argsSize = -1;
    m_savedRegSize = -1;
#endif

    if (this->IsJitInDebugMode())
    {
        m_nonTempLocalVars = Anew(this->m_alloc, BVSparse<JitArenaAllocator>, this->m_alloc);
    }

    if (GetJITFunctionBody()->IsCoroutine())
    {
        m_yieldOffsetResumeLabelList = YieldOffsetResumeLabelList::New(this->m_alloc);
    }

    if (this->IsTopFunc())
    {
        m_globalObjTypeSpecFldInfoArray = JitAnewArrayZ(this->m_alloc, ObjTypeSpecFldInfo*, GetWorkItem()->GetJITTimeInfo()->GetGlobalObjTypeSpecFldInfoCount());
    }

    for (uint i = 0; i < GetJITFunctionBody()->GetInlineCacheCount(); ++i)
    {
        ObjTypeSpecFldInfo * info = GetWorkItem()->GetJITTimeInfo()->GetObjTypeSpecFldInfo(i);
        if (info != nullptr)
        {
            AssertOrFailFast(info->GetObjTypeSpecFldId() < GetTopFunc()->GetWorkItem()->GetJITTimeInfo()->GetGlobalObjTypeSpecFldInfoCount());
            GetTopFunc()->m_globalObjTypeSpecFldInfoArray[info->GetObjTypeSpecFldId()] = info;
        }
    }

    canHoistConstantAddressLoad = !PHASE_OFF(Js::HoistConstAddrPhase, this);

    m_forInLoopMaxDepth = this->GetJITFunctionBody()->GetForInLoopDepth();
}